

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O0

size_t fiobj_str_write_i(FIOBJ dest,int64_t num)

{
  size_t sVar1;
  fio_str_info_s local_38;
  int64_t local_20;
  int64_t num_local;
  FIOBJ dest_local;
  
  local_20 = num;
  num_local = dest;
  sVar1 = fiobj_type_is(dest,FIOBJ_T_STRING);
  if (sVar1 != 0) {
    if (*(char *)((num_local & 0xfffffffffffffff8U) + 0x11) == '\0') {
      *(undefined8 *)((num_local & 0xfffffffffffffff8U) + 8) = 0;
      fio_str_write_i(&local_38,(fio_str_s_conflict *)((num_local & 0xfffffffffffffff8U) + 0x10),
                      local_20);
      dest_local = local_38.len;
    }
    else {
      dest_local = 0;
    }
    return dest_local;
  }
  __assert_fail("FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_str.c"
                ,0x103,"size_t fiobj_str_write_i(FIOBJ, int64_t)");
}

Assistant:

size_t fiobj_str_write_i(FIOBJ dest, int64_t num) {
  assert(FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING));
  if (obj2str(dest)->str.frozen)
    return 0;
  obj2str(dest)->hash = 0;
  return fio_str_write_i(&obj2str(dest)->str, num).len;
}